

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fixBoundingBox(Rtree *pRtree,RtreeNode *pNode)

{
  int iVar1;
  undefined1 local_90 [8];
  RtreeCell cell;
  RtreeCell box;
  int local_28;
  int nCell;
  int ii;
  int rc;
  RtreeNode *pParent;
  RtreeNode *pNode_local;
  Rtree *pRtree_local;
  
  _ii = pNode->pParent;
  nCell = 0;
  if (_ii != (RtreeNode *)0x0) {
    pParent = pNode;
    pNode_local = (RtreeNode *)pRtree;
    iVar1 = readInt16(pNode->zData + 2);
    nodeGetCell((Rtree *)pNode_local,pParent,0,(RtreeCell *)(cell.aCoord + 8));
    for (local_28 = 1; local_28 < iVar1; local_28 = local_28 + 1) {
      nodeGetCell((Rtree *)pNode_local,pParent,local_28,(RtreeCell *)local_90);
      cellUnion((Rtree *)pNode_local,(RtreeCell *)(cell.aCoord + 8),(RtreeCell *)local_90);
    }
    cell.aCoord._32_8_ = pParent->iNode;
    nCell = nodeParentIndex((Rtree *)pNode_local,pParent,&local_28);
    if (nCell == 0) {
      nodeOverwriteCell((Rtree *)pNode_local,_ii,(RtreeCell *)(cell.aCoord + 8),local_28);
      nCell = fixBoundingBox((Rtree *)pNode_local,_ii);
    }
  }
  return nCell;
}

Assistant:

static int fixBoundingBox(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode *pParent = pNode->pParent;
  int rc = SQLITE_OK; 
  if( pParent ){
    int ii; 
    int nCell = NCELL(pNode);
    RtreeCell box;                            /* Bounding box for pNode */
    nodeGetCell(pRtree, pNode, 0, &box);
    for(ii=1; ii<nCell; ii++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, ii, &cell);
      cellUnion(pRtree, &box, &cell);
    }
    box.iRowid = pNode->iNode;
    rc = nodeParentIndex(pRtree, pNode, &ii);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &box, ii);
      rc = fixBoundingBox(pRtree, pParent);
    }
  }
  return rc;
}